

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int vm_builtin_parse_url(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  char *zUri;
  int local_ec;
  jx9_value *pjStack_e8;
  int iPort_1;
  jx9_value *pValue;
  jx9_value *pArray;
  int iPort;
  int nComponent;
  sxi32 rc;
  int nLen;
  SyhttpUri sURI;
  SyString *pComp;
  char *zStr;
  jx9_value **apArg_local;
  int nArg_local;
  jx9_context *pCtx_local;
  
  if ((nArg < 1) || (iVar1 = jx9_value_is_string(*apArg), iVar1 == 0)) {
    jx9_result_bool(pCtx,0);
  }
  else {
    zUri = jx9_value_to_string(*apArg,&nComponent);
    if (nComponent < 1) {
      jx9_result_bool(pCtx,0);
    }
    else {
      iPort = VmHttpSplitURI((SyhttpUri *)&rc,zUri,nComponent);
      if (iPort == 0) {
        if (nArg < 2) {
          pValue = jx9_context_new_array(pCtx);
          pjStack_e8 = jx9_context_new_scalar(pCtx);
          if ((pValue == (jx9_value *)0x0) || (pjStack_e8 == (jx9_value *)0x0)) {
            jx9_context_throw_error(pCtx,1,"jx9 engine is running out of memory");
            jx9_result_bool(pCtx,0);
          }
          else {
            sURI.sRaw._8_8_ = &sURI.sFragment.nByte;
            if ((int)sURI.sScheme.zString != 0) {
              jx9_value_string(pjStack_e8,(char *)sURI.sFragment._8_8_,(int)sURI.sScheme.zString);
              jx9_array_add_strkey_elem(pValue,"scheme",pjStack_e8);
            }
            jx9_value_reset_string_cursor(pjStack_e8);
            sURI.sRaw._8_8_ = &rc;
            if ((int)sURI.sHost.zString != 0) {
              jx9_value_string(pjStack_e8,_rc,(int)sURI.sHost.zString);
              jx9_array_add_strkey_elem(pValue,"host",pjStack_e8);
            }
            jx9_value_reset_string_cursor(pjStack_e8);
            sURI.sRaw._8_8_ = &sURI.sHost.nByte;
            if ((sxu32)sURI.sPort.zString != 0) {
              local_ec = 0;
              SyStrToInt32((char *)sURI.sHost._8_8_,(sxu32)sURI.sPort.zString,&local_ec,(char **)0x0
                          );
              jx9_value_int(pjStack_e8,local_ec);
              jx9_array_add_strkey_elem(pValue,"port",pjStack_e8);
            }
            jx9_value_reset_string_cursor(pjStack_e8);
            sURI.sRaw._8_8_ = &sURI.sScheme.nByte;
            if ((int)sURI.sUser.zString != 0) {
              jx9_value_string(pjStack_e8,(char *)sURI.sScheme._8_8_,(int)sURI.sUser.zString);
              jx9_array_add_strkey_elem(pValue,"user",pjStack_e8);
            }
            jx9_value_reset_string_cursor(pjStack_e8);
            sURI.sRaw._8_8_ = &sURI.sUser.nByte;
            if ((int)sURI.sPass.zString != 0) {
              jx9_value_string(pjStack_e8,(char *)sURI.sUser._8_8_,(int)sURI.sPass.zString);
              jx9_array_add_strkey_elem(pValue,"pass",pjStack_e8);
            }
            jx9_value_reset_string_cursor(pjStack_e8);
            sURI.sRaw._8_8_ = &sURI.sPort.nByte;
            if ((int)sURI.sPath.zString != 0) {
              jx9_value_string(pjStack_e8,(char *)sURI.sPort._8_8_,(int)sURI.sPath.zString);
              jx9_array_add_strkey_elem(pValue,"path",pjStack_e8);
            }
            jx9_value_reset_string_cursor(pjStack_e8);
            sURI.sRaw._8_8_ = &sURI.sPath.nByte;
            if ((int)sURI.sQuery.zString != 0) {
              jx9_value_string(pjStack_e8,(char *)sURI.sPath._8_8_,(int)sURI.sQuery.zString);
              jx9_array_add_strkey_elem(pValue,"query",pjStack_e8);
            }
            jx9_value_reset_string_cursor(pjStack_e8);
            sURI.sRaw._8_8_ = &sURI.sQuery.nByte;
            if ((int)sURI.sFragment.zString != 0) {
              jx9_value_string(pjStack_e8,(char *)sURI.sQuery._8_8_,(int)sURI.sFragment.zString);
              jx9_array_add_strkey_elem(pValue,"fragment",pjStack_e8);
            }
            jx9_result_value(pCtx,pValue);
          }
        }
        else {
          pArray._4_4_ = jx9_value_to_int(apArg[1]);
          switch(pArray._4_4_) {
          case 1:
            sURI.sRaw._8_8_ = &sURI.sFragment.nByte;
            if ((int)sURI.sScheme.zString == 0) {
              jx9_result_null(pCtx);
            }
            else {
              jx9_result_string(pCtx,(char *)sURI.sFragment._8_8_,(int)sURI.sScheme.zString);
            }
            break;
          case 2:
            sURI.sRaw._8_8_ = &rc;
            if ((int)sURI.sHost.zString == 0) {
              jx9_result_null(pCtx);
            }
            else {
              jx9_result_string(pCtx,_rc,(int)sURI.sHost.zString);
            }
            break;
          case 3:
            sURI.sRaw._8_8_ = &sURI.sHost.nByte;
            if ((sxu32)sURI.sPort.zString == 0) {
              jx9_result_null(pCtx);
            }
            else {
              pArray._0_4_ = 0;
              SyStrToInt32((char *)sURI.sHost._8_8_,(sxu32)sURI.sPort.zString,&pArray,(char **)0x0);
              jx9_result_int(pCtx,(int)pArray);
            }
            break;
          case 4:
            sURI.sRaw._8_8_ = &sURI.sScheme.nByte;
            if ((int)sURI.sUser.zString == 0) {
              jx9_result_null(pCtx);
            }
            else {
              jx9_result_string(pCtx,(char *)sURI.sScheme._8_8_,(int)sURI.sUser.zString);
            }
            break;
          case 5:
            sURI.sRaw._8_8_ = &sURI.sUser.nByte;
            if ((int)sURI.sPass.zString == 0) {
              jx9_result_null(pCtx);
            }
            else {
              jx9_result_string(pCtx,(char *)sURI.sUser._8_8_,(int)sURI.sPass.zString);
            }
            break;
          case 6:
            sURI.sRaw._8_8_ = &sURI.sPort.nByte;
            if ((int)sURI.sPath.zString == 0) {
              jx9_result_null(pCtx);
            }
            else {
              jx9_result_string(pCtx,(char *)sURI.sPort._8_8_,(int)sURI.sPath.zString);
            }
            break;
          case 7:
            sURI.sRaw._8_8_ = &sURI.sPath.nByte;
            if ((int)sURI.sQuery.zString == 0) {
              jx9_result_null(pCtx);
            }
            else {
              jx9_result_string(pCtx,(char *)sURI.sPath._8_8_,(int)sURI.sQuery.zString);
            }
            break;
          case 8:
            sURI.sRaw._8_8_ = &sURI.sQuery.nByte;
            if ((int)sURI.sFragment.zString == 0) {
              jx9_result_null(pCtx);
            }
            else {
              jx9_result_string(pCtx,(char *)sURI.sQuery._8_8_,(int)sURI.sFragment.zString);
            }
            break;
          default:
            jx9_result_null(pCtx);
          }
        }
      }
      else {
        jx9_result_bool(pCtx,0);
      }
    }
  }
  return 0;
}

Assistant:

static int vm_builtin_parse_url(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zStr; /* Input string */
	SyString *pComp;  /* Pointer to the URI component */
	SyhttpUri sURI;   /* Parse of the given URI */
	int nLen;
	sxi32 rc;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid arguments, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the given URI */
	zStr = jx9_value_to_string(apArg[0], &nLen);
	if( nLen < 1 ){
		/* Nothing to process, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Get a parse */
	rc = VmHttpSplitURI(&sURI, zStr, (sxu32)nLen);
	if( rc != SXRET_OK ){
		/* Malformed input, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	if( nArg > 1 ){
		int nComponent = jx9_value_to_int(apArg[1]);
		/* Refer to constant.c for constants values */
		switch(nComponent){
		case 1: /* JX9_URL_SCHEME */
			pComp = &sURI.sScheme;
			if( pComp->nByte < 1 ){
				/* No available value, return NULL */
				jx9_result_null(pCtx);
			}else{
				jx9_result_string(pCtx, pComp->zString, (int)pComp->nByte);
			}
			break;
		case 2: /* JX9_URL_HOST */
			pComp = &sURI.sHost;
			if( pComp->nByte < 1 ){
				/* No available value, return NULL */
				jx9_result_null(pCtx);
			}else{
				jx9_result_string(pCtx, pComp->zString, (int)pComp->nByte);
			}
			break;
		case 3: /* JX9_URL_PORT */
			pComp = &sURI.sPort;
			if( pComp->nByte < 1 ){
				/* No available value, return NULL */
				jx9_result_null(pCtx);
			}else{
				int iPort = 0;
				/* Cast the value to integer */
				SyStrToInt32(pComp->zString, pComp->nByte, (void *)&iPort, 0);
				jx9_result_int(pCtx, iPort);
			}
			break;
		case 4: /* JX9_URL_USER */
			pComp = &sURI.sUser;
			if( pComp->nByte < 1 ){
				/* No available value, return NULL */
				jx9_result_null(pCtx);
			}else{
				jx9_result_string(pCtx, pComp->zString, (int)pComp->nByte);
			}
			break;
		case 5: /* JX9_URL_PASS */
			pComp = &sURI.sPass;
			if( pComp->nByte < 1 ){
				/* No available value, return NULL */
				jx9_result_null(pCtx);
			}else{
				jx9_result_string(pCtx, pComp->zString, (int)pComp->nByte);
			}
			break;
		case 7: /* JX9_URL_QUERY */
			pComp = &sURI.sQuery;
			if( pComp->nByte < 1 ){
				/* No available value, return NULL */
				jx9_result_null(pCtx);
			}else{
				jx9_result_string(pCtx, pComp->zString, (int)pComp->nByte);
			}
			break;
		case 8: /* JX9_URL_FRAGMENT */
			pComp = &sURI.sFragment;
			if( pComp->nByte < 1 ){
				/* No available value, return NULL */
				jx9_result_null(pCtx);
			}else{
				jx9_result_string(pCtx, pComp->zString, (int)pComp->nByte);
			}
			break;
		case 6: /*  JX9_URL_PATH */
			pComp = &sURI.sPath;
			if( pComp->nByte < 1 ){
				/* No available value, return NULL */
				jx9_result_null(pCtx);
			}else{
				jx9_result_string(pCtx, pComp->zString, (int)pComp->nByte);
			}
			break;
		default:
			/* No such entry, return NULL */
			jx9_result_null(pCtx);
			break;
		}
	}else{
		jx9_value *pArray, *pValue;
		/* Return an associative array */
		pArray = jx9_context_new_array(pCtx);  /* Empty array */
		pValue = jx9_context_new_scalar(pCtx); /* Array value */
		if( pArray == 0 || pValue == 0 ){
			/* Out of memory */
			jx9_context_throw_error(pCtx, JX9_CTX_ERR, "jx9 engine is running out of memory");
			/* Return false */
			jx9_result_bool(pCtx, 0);
			return JX9_OK;
		}
		/* Fill the array */
		pComp = &sURI.sScheme;
		if( pComp->nByte > 0 ){
			jx9_value_string(pValue, pComp->zString, (int)pComp->nByte);
			jx9_array_add_strkey_elem(pArray, "scheme", pValue); /* Will make it's own copy */
		}
		/* Reset the string cursor */
		jx9_value_reset_string_cursor(pValue);
		pComp = &sURI.sHost;
		if( pComp->nByte > 0 ){
			jx9_value_string(pValue, pComp->zString, (int)pComp->nByte);
			jx9_array_add_strkey_elem(pArray, "host", pValue); /* Will make it's own copy */
		}
		/* Reset the string cursor */
		jx9_value_reset_string_cursor(pValue);
		pComp = &sURI.sPort;
		if( pComp->nByte > 0 ){
			int iPort = 0;/* cc warning */
			/* Convert to integer */
			SyStrToInt32(pComp->zString, pComp->nByte, (void *)&iPort, 0);
			jx9_value_int(pValue, iPort);
			jx9_array_add_strkey_elem(pArray, "port", pValue); /* Will make it's own copy */
		}
		/* Reset the string cursor */
		jx9_value_reset_string_cursor(pValue);
		pComp = &sURI.sUser;
		if( pComp->nByte > 0 ){
			jx9_value_string(pValue, pComp->zString, (int)pComp->nByte);
			jx9_array_add_strkey_elem(pArray, "user", pValue); /* Will make it's own copy */
		}
		/* Reset the string cursor */
		jx9_value_reset_string_cursor(pValue);
		pComp = &sURI.sPass;
		if( pComp->nByte > 0 ){
			jx9_value_string(pValue, pComp->zString, (int)pComp->nByte);
			jx9_array_add_strkey_elem(pArray, "pass", pValue); /* Will make it's own copy */
		}
		/* Reset the string cursor */
		jx9_value_reset_string_cursor(pValue);
		pComp = &sURI.sPath;
		if( pComp->nByte > 0 ){
			jx9_value_string(pValue, pComp->zString, (int)pComp->nByte);
			jx9_array_add_strkey_elem(pArray, "path", pValue); /* Will make it's own copy */
		}
		/* Reset the string cursor */
		jx9_value_reset_string_cursor(pValue);
		pComp = &sURI.sQuery;
		if( pComp->nByte > 0 ){
			jx9_value_string(pValue, pComp->zString, (int)pComp->nByte);
			jx9_array_add_strkey_elem(pArray, "query", pValue); /* Will make it's own copy */
		}
		/* Reset the string cursor */
		jx9_value_reset_string_cursor(pValue);
		pComp = &sURI.sFragment;
		if( pComp->nByte > 0 ){
			jx9_value_string(pValue, pComp->zString, (int)pComp->nByte);
			jx9_array_add_strkey_elem(pArray, "fragment", pValue); /* Will make it's own copy */
		}
		/* Return the created array */
		jx9_result_value(pCtx, pArray);
		/* NOTE:
		 * Don't worry about freeing 'pValue', everything will be released
		 * automatically as soon we return from this function.
		 */
	}
	/* All done */
	return JX9_OK;
}